

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  uint8_t *puVar2;
  short sVar3;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar4 [16];
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar22;
  undefined1 auVar21 [16];
  ushort uVar23;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar24 [16];
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  
  auVar4 = pshuflw(ZEXT116(top_row[0xf]),ZEXT116(top_row[0xf]),0);
  uVar1 = *(undefined4 *)left_column;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                       CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1)) >> 0x10),
                       (short)uVar1) & 0xffff00ff00ff00ff;
  sVar10 = auVar4._0_2_;
  sVar11 = auVar4._2_2_;
  auVar4 = pshuflw((undefined1  [16])0x0,auVar21,0);
  sVar20 = auVar4._0_2_;
  sVar22 = auVar4._2_2_;
  sVar12 = sVar10 + 0x80;
  sVar13 = sVar11 * 0x1f + 0x80;
  sVar14 = sVar10 * 0x3c + 0x80;
  sVar15 = sVar11 * 0x56 + 0x80;
  sVar16 = sVar10 * 0x6f + 0x80;
  sVar17 = sVar11 * 0x85 + 0x80;
  sVar18 = sVar10 * 0x9a + 0x80;
  sVar19 = sVar11 * 0xac + 0x80;
  uVar32 = sVar20 * 0xff + sVar12;
  uVar34 = sVar22 * 0xe1 + sVar13;
  uVar36 = sVar20 * 0xc4 + sVar14;
  uVar38 = sVar22 * 0xaa + sVar15;
  uVar40 = sVar20 * 0x91 + sVar16;
  uVar44 = sVar22 * 0x7b + sVar17;
  uVar48 = sVar20 * 0x66 + sVar18;
  uVar52 = sVar22 * 0x54 + sVar19;
  uVar33 = uVar32 >> 8;
  uVar35 = uVar34 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  sVar3 = sVar10 * 0xbc + 0x80;
  sVar5 = sVar11 * 0xca + 0x80;
  sVar6 = sVar10 * 0xd5 + 0x80;
  sVar7 = sVar11 * 0xdf + 0x80;
  sVar8 = sVar10 * 0xe6 + 0x80;
  sVar9 = sVar11 * 0xec + 0x80;
  sVar10 = sVar10 * 0xef + 0x80;
  sVar11 = sVar11 * 0xf0 + 0x80;
  uVar23 = sVar20 * 0x44 + sVar3;
  uVar25 = sVar22 * 0x36 + sVar5;
  uVar26 = sVar20 * 0x2b + sVar6;
  uVar27 = sVar22 * 0x21 + sVar7;
  uVar28 = sVar20 * 0x1a + sVar8;
  uVar29 = sVar22 * 0x14 + sVar9;
  uVar30 = sVar20 * 0x11 + sVar10;
  uVar31 = sVar22 * 0x10 + sVar11;
  auVar4._0_2_ = uVar23 >> 8;
  auVar4._2_2_ = uVar25 >> 8;
  auVar4._4_2_ = uVar26 >> 8;
  auVar4._6_2_ = uVar27 >> 8;
  auVar4._8_2_ = uVar28 >> 8;
  auVar4._10_2_ = uVar29 >> 8;
  auVar4._12_2_ = uVar30 >> 8;
  auVar4._14_2_ = uVar31 >> 8;
  *dst = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
  dst[1] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
  dst[2] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
  dst[3] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
  dst[4] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
  dst[5] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  dst[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  dst[7] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  dst[8] = (auVar4._0_2_ != 0) * (auVar4._0_2_ < 0x100) * (char)(uVar23 >> 8) -
           (0xff < auVar4._0_2_);
  dst[9] = (auVar4._2_2_ != 0) * (auVar4._2_2_ < 0x100) * (char)(uVar25 >> 8) -
           (0xff < auVar4._2_2_);
  dst[10] = (auVar4._4_2_ != 0) * (auVar4._4_2_ < 0x100) * (char)(uVar26 >> 8) -
            (0xff < auVar4._4_2_);
  dst[0xb] = (auVar4._6_2_ != 0) * (auVar4._6_2_ < 0x100) * (char)(uVar27 >> 8) -
             (0xff < auVar4._6_2_);
  dst[0xc] = (auVar4._8_2_ != 0) * (auVar4._8_2_ < 0x100) * (char)(uVar28 >> 8) -
             (0xff < auVar4._8_2_);
  dst[0xd] = (auVar4._10_2_ != 0) * (auVar4._10_2_ < 0x100) * (char)(uVar29 >> 8) -
             (0xff < auVar4._10_2_);
  dst[0xe] = (auVar4._12_2_ != 0) * (auVar4._12_2_ < 0x100) * (char)(uVar30 >> 8) -
             (0xff < auVar4._12_2_);
  dst[0xf] = (auVar4._14_2_ != 0) * (auVar4._14_2_ < 0x100) * (char)(uVar31 >> 8) -
             (0xff < auVar4._14_2_);
  auVar4 = pshuflw(auVar4,auVar21,0x55);
  sVar20 = auVar4._0_2_;
  sVar22 = auVar4._2_2_;
  uVar32 = sVar20 * 0xff + sVar12;
  uVar34 = sVar22 * 0xe1 + sVar13;
  uVar36 = sVar20 * 0xc4 + sVar14;
  uVar38 = sVar22 * 0xaa + sVar15;
  uVar40 = sVar20 * 0x91 + sVar16;
  uVar44 = sVar22 * 0x7b + sVar17;
  uVar48 = sVar20 * 0x66 + sVar18;
  uVar52 = sVar22 * 0x54 + sVar19;
  uVar33 = uVar32 >> 8;
  uVar35 = uVar34 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  uVar23 = sVar20 * 0x44 + sVar3;
  uVar25 = sVar22 * 0x36 + sVar5;
  uVar26 = sVar20 * 0x2b + sVar6;
  uVar27 = sVar22 * 0x21 + sVar7;
  uVar28 = sVar20 * 0x1a + sVar8;
  uVar29 = sVar22 * 0x14 + sVar9;
  uVar30 = sVar20 * 0x11 + sVar10;
  uVar31 = sVar22 * 0x10 + sVar11;
  auVar24._0_2_ = uVar23 >> 8;
  auVar24._2_2_ = uVar25 >> 8;
  auVar24._4_2_ = uVar26 >> 8;
  auVar24._6_2_ = uVar27 >> 8;
  auVar24._8_2_ = uVar28 >> 8;
  auVar24._10_2_ = uVar29 >> 8;
  auVar24._12_2_ = uVar30 >> 8;
  auVar24._14_2_ = uVar31 >> 8;
  puVar2 = dst + stride;
  *puVar2 = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
  puVar2[1] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
  puVar2[2] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
  puVar2[3] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
  puVar2[4] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
  puVar2[5] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar2[6] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar2[7] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar2[8] = (auVar24._0_2_ != 0) * (auVar24._0_2_ < 0x100) * (char)(uVar23 >> 8) -
              (0xff < auVar24._0_2_);
  puVar2[9] = (auVar24._2_2_ != 0) * (auVar24._2_2_ < 0x100) * (char)(uVar25 >> 8) -
              (0xff < auVar24._2_2_);
  puVar2[10] = (auVar24._4_2_ != 0) * (auVar24._4_2_ < 0x100) * (char)(uVar26 >> 8) -
               (0xff < auVar24._4_2_);
  puVar2[0xb] = (auVar24._6_2_ != 0) * (auVar24._6_2_ < 0x100) * (char)(uVar27 >> 8) -
                (0xff < auVar24._6_2_);
  puVar2[0xc] = (auVar24._8_2_ != 0) * (auVar24._8_2_ < 0x100) * (char)(uVar28 >> 8) -
                (0xff < auVar24._8_2_);
  puVar2[0xd] = (auVar24._10_2_ != 0) * (auVar24._10_2_ < 0x100) * (char)(uVar29 >> 8) -
                (0xff < auVar24._10_2_);
  puVar2[0xe] = (auVar24._12_2_ != 0) * (auVar24._12_2_ < 0x100) * (char)(uVar30 >> 8) -
                (0xff < auVar24._12_2_);
  puVar2[0xf] = (auVar24._14_2_ != 0) * (auVar24._14_2_ < 0x100) * (char)(uVar31 >> 8) -
                (0xff < auVar24._14_2_);
  auVar4 = pshuflw(auVar24,auVar21,0xaa);
  sVar20 = auVar4._0_2_;
  sVar22 = auVar4._2_2_;
  uVar40 = sVar20 * 0xff + sVar12;
  uVar44 = sVar22 * 0xe1 + sVar13;
  uVar48 = sVar20 * 0xc4 + sVar14;
  uVar52 = sVar22 * 0xaa + sVar15;
  uVar42 = sVar20 * 0x91 + sVar16;
  uVar46 = sVar22 * 0x7b + sVar17;
  uVar50 = sVar20 * 0x66 + sVar18;
  uVar54 = sVar22 * 0x54 + sVar19;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  uVar43 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar51 = uVar50 >> 8;
  uVar55 = uVar54 >> 8;
  uVar23 = sVar20 * 0x44 + sVar3;
  uVar26 = sVar22 * 0x36 + sVar5;
  uVar28 = sVar20 * 0x2b + sVar6;
  uVar30 = sVar22 * 0x21 + sVar7;
  uVar32 = sVar20 * 0x1a + sVar8;
  uVar34 = sVar22 * 0x14 + sVar9;
  uVar36 = sVar20 * 0x11 + sVar10;
  uVar38 = sVar22 * 0x10 + sVar11;
  uVar25 = uVar23 >> 8;
  uVar27 = uVar26 >> 8;
  uVar29 = uVar28 >> 8;
  uVar31 = uVar30 >> 8;
  uVar33 = uVar32 >> 8;
  uVar35 = uVar34 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  puVar2 = dst + stride * 2;
  *puVar2 = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
  puVar2[1] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar2[2] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar2[3] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar2[4] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
  puVar2[5] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
  puVar2[6] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
  puVar2[7] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
  puVar2[8] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar25);
  puVar2[9] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
  puVar2[10] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
  puVar2[0xb] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
  puVar2[0xc] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
  puVar2[0xd] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
  puVar2[0xe] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
  puVar2[0xf] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
  puVar2 = dst + stride * 3;
  auVar4 = pshuflw(auVar21,auVar21,0xff);
  sVar20 = auVar4._0_2_;
  sVar22 = auVar4._2_2_;
  uVar23 = sVar20 * 0xff + sVar12;
  uVar26 = sVar22 * 0xe1 + sVar13;
  uVar28 = sVar20 * 0xc4 + sVar14;
  uVar30 = sVar22 * 0xaa + sVar15;
  uVar32 = sVar20 * 0x91 + sVar16;
  uVar34 = sVar22 * 0x7b + sVar17;
  uVar36 = sVar20 * 0x66 + sVar18;
  uVar38 = sVar22 * 0x54 + sVar19;
  uVar25 = uVar23 >> 8;
  uVar27 = uVar26 >> 8;
  uVar29 = uVar28 >> 8;
  uVar31 = uVar30 >> 8;
  uVar33 = uVar32 >> 8;
  uVar35 = uVar34 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  uVar40 = sVar20 * 0x44 + sVar3;
  uVar44 = sVar22 * 0x36 + sVar5;
  uVar48 = sVar20 * 0x2b + sVar6;
  uVar52 = sVar22 * 0x21 + sVar7;
  uVar42 = sVar20 * 0x1a + sVar8;
  uVar46 = sVar22 * 0x14 + sVar9;
  uVar50 = sVar20 * 0x11 + sVar10;
  uVar54 = sVar22 * 0x10 + sVar11;
  uVar41 = uVar40 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  uVar43 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar51 = uVar50 >> 8;
  uVar55 = uVar54 >> 8;
  *puVar2 = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar25);
  puVar2[1] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
  puVar2[2] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
  puVar2[3] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
  puVar2[4] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
  puVar2[5] = (uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35);
  puVar2[6] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
  puVar2[7] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
  puVar2[8] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
  puVar2[9] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar2[10] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar2[0xb] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar2[0xc] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
  puVar2[0xd] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
  puVar2[0xe] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
  puVar2[0xf] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
  return;
}

Assistant:

void aom_smooth_h_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i left = cvtepu8_epi16(Load4(left_column));
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_mask = _mm_set1_epi32(0x01000100);
  __m128i left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x03020302);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x05040504);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
  dst += stride;
  y_mask = _mm_set1_epi32(0x07060706);
  left_y = _mm_shuffle_epi8(left, y_mask);
  write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                 scaled_top_right1, scaled_top_right2, round);
}